

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr
          (ExprVisitorDelegate *this,ReturnCallIndirectExpr *expr)

{
  WatWriter *this_00;
  Index index;
  char *s;
  Var type_var;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::ReturnCallIndirect_Opcode);
  WritePutsSpace(this_00,s);
  WriteOpenSpace(this->writer_,"type");
  if ((expr->decl).has_func_type == true) {
    Var::Var(&type_var,&(expr->decl).type_var);
  }
  else {
    index = Module::GetFuncTypeIndex((this->writer_->super_ModuleContext).module,&expr->decl);
    Var::Var(&type_var,index,&(expr->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc);
  }
  WriteVar(this->writer_,&type_var,Space);
  WriteCloseNewline(this->writer_);
  Var::~Var(&type_var);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnReturnCallIndirectExpr(
    ReturnCallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::ReturnCallIndirect_Opcode.GetName());
  writer_->WriteOpenSpace("type");
  const auto type_var =
      expr->decl.has_func_type
          ? expr->decl.type_var
          : Var{writer_->module.GetFuncTypeIndex(expr->decl), expr->loc};
  writer_->WriteVar(type_var, NextChar::Space);
  writer_->WriteCloseNewline();
  return Result::Ok;
}